

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestReaderTestparseWithOneError::runTestCase(TestReaderTestparseWithOneError *this)

{
  bool bVar1;
  reference pvVar2;
  allocator local_171;
  vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_> errors;
  Value root;
  Reader reader;
  
  Json::Reader::Reader(&reader);
  Json::Value::Value(&root,nullValue);
  std::__cxx11::string::string((string *)&errors,"{ \"property\" :: \"value\" }",&local_171);
  bVar1 = Json::Reader::parse(&reader,(string *)&errors,&root,true);
  std::__cxx11::string::~string((string *)&errors);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6c1,"!ok");
  }
  Json::Reader::getFormattedErrorMessages_abi_cxx11_((string *)&errors,&reader);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &errors,
                          "* Line 1, Column 15\n  Syntax error: value, object or array expected.\n")
  ;
  std::__cxx11::string::~string((string *)&errors);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6c4,
               "reader.getFormattedErrorMessages() == \"* Line 1, Column 15\\n  Syntax error: value, object or array \" \"expected.\\n\""
              );
  }
  Json::Reader::getStructuredErrors(&errors,&reader);
  if ((long)errors.
            super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)errors.
            super__Vector_base<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x30) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6c7,"errors.size() == 1");
  }
  pvVar2 = std::
           vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::at
                     (&errors,0);
  if (pvVar2->offset_start != 0xe) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6c8,"errors.at(0).offset_start == 14");
  }
  pvVar2 = std::
           vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::at
                     (&errors,0);
  if (pvVar2->offset_limit != 0xf) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6c9,"errors.at(0).offset_limit == 15");
  }
  pvVar2 = std::
           vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::at
                     (&errors,0);
  bVar1 = std::operator==(&pvVar2->message,"Syntax error: value, object or array expected.");
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              ((this->super_ReaderTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x6cb,"errors.at(0).message == \"Syntax error: value, object or array expected.\"");
  }
  std::vector<Json::Reader::StructuredError,_std::allocator<Json::Reader::StructuredError>_>::
  ~vector(&errors);
  Json::Value::~Value(&root);
  Json::Reader::~Reader(&reader);
  return;
}

Assistant:

JSONTEST_FIXTURE(ReaderTest, parseWithOneError) {
  Json::Reader reader;
  Json::Value root;
  bool ok = reader.parse("{ \"property\" :: \"value\" }", root);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT(reader.getFormattedErrorMessages() ==
                  "* Line 1, Column 15\n  Syntax error: value, object or array "
                  "expected.\n");
  std::vector<Json::Reader::StructuredError> errors =
      reader.getStructuredErrors();
  JSONTEST_ASSERT(errors.size() == 1);
  JSONTEST_ASSERT(errors.at(0).offset_start == 14);
  JSONTEST_ASSERT(errors.at(0).offset_limit == 15);
  JSONTEST_ASSERT(errors.at(0).message ==
                  "Syntax error: value, object or array expected.");
}